

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O2

CURLcode operate(GlobalConfig *global,int argc,char **argv)

{
  char *pcVar1;
  undefined8 uVar2;
  byte bVar3;
  int iVar4;
  ParameterError PVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  CURLSH *share;
  per_transfer *ppVar8;
  CURLM *multi;
  long lVar9;
  time_t tVar10;
  time_t tVar11;
  OperationConfig *config;
  size_t i;
  bool bVar12;
  bool bVar13;
  _Bool added_transfers;
  _Bool more_transfers;
  _Bool local_6b;
  _Bool local_6a;
  _Bool retry_1;
  _Bool retry_2;
  undefined7 uStack_67;
  int still_running;
  _Bool retry;
  undefined7 uStack_57;
  timeval start;
  long local_40;
  int rc;
  
  pcVar1 = argv[1];
  setlocale(6,"");
  CVar6 = CURLE_FAILED_INIT;
  if ((((argc == 1) ||
       ((iVar4 = curl_strequal(pcVar1,"-q"), iVar4 == 0 &&
        (iVar4 = curl_strequal(pcVar1,"--disable"), iVar4 == 0)))) &&
      (parseconfig((char *)0x0,global), argc < 2)) && (global->first->url_list == (getout *)0x0)) {
    helpf(global->errors,(char *)0x0);
    return CURLE_FAILED_INIT;
  }
  PVar5 = parse_args(global,argc,argv);
  switch(PVar5) {
  case PARAM_OK:
    if ((global->libcurl != (char *)0x0) && (CVar6 = easysrc_init(), CVar6 != CURLE_OK)) {
      errorf(global,"out of memory\n");
      return CVar6;
    }
    config = global->first;
    share = (CURLSH *)curl_share_init();
    if (share == (CURLSH *)0x0) {
      if (global->libcurl == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      easysrc_cleanup();
      return CURLE_OUT_OF_MEMORY;
    }
    i = 0;
    curl_share_setopt(share,1,2);
    curl_share_setopt(share,1,3);
    curl_share_setopt(share,1,4);
    curl_share_setopt(share,1,5);
    curl_share_setopt(share,1,6);
    do {
      CVar6 = get_args(config,i);
      if (CVar6 != CURLE_OK) break;
      i = i + 1;
      config = config->next;
    } while (config != (OperationConfig *)0x0);
    global->current = global->first;
    local_6a = global->noprogress;
    local_6b = global->isatty;
    if (CVar6 == CURLE_OK) {
      if (global->parallel == true) {
        still_running = 1;
        start = tvnow();
        local_40 = time((time_t *)0x0);
        multi = (CURLM *)curl_multi_init();
        CVar6 = CURLE_OUT_OF_MEMORY;
        if (multi != (CURLM *)0x0) {
          CVar6 = add_parallel_transfers(global,multi,share,&more_transfers,&added_transfers);
          if (CVar6 == CURLE_OK) {
            CVar6 = CURLE_OK;
            iVar4 = 0;
            bVar3 = more_transfers;
            while (iVar4 == 0) {
              if ((still_running == 0) && ((bVar3 & 1) == 0)) {
                progress_meter(global,&start,true);
                goto LAB_00113b77;
              }
              iVar4 = curl_multi_poll(multi,0,0,1000,0);
              if (iVar4 == 0) {
                iVar4 = curl_multi_perform(multi,&still_running);
              }
              progress_meter(global,&start,false);
              if (iVar4 == 0) {
                bVar12 = false;
                while (lVar9 = curl_multi_info_read(), lVar9 != 0) {
                  uVar2 = *(undefined8 *)(lVar9 + 8);
                  CVar6 = *(CURLcode *)(lVar9 + 0x10);
                  curl_easy_getinfo(uVar2,0x100015,&retry_2);
                  curl_multi_remove_handle(multi,uVar2);
                  CVar6 = post_per_transfer(global,(per_transfer *)CONCAT71(uStack_67,retry_2),CVar6
                                            ,&retry_1,(long *)&retry);
                  progress_finalize((per_transfer *)CONCAT71(uStack_67,retry_2));
                  all_added = all_added + -1;
                  ppVar8 = (per_transfer *)CONCAT71(uStack_67,retry_2);
                  if (retry_1 == true) {
                    ppVar8->added = false;
                    lVar9 = CONCAT71(uStack_57,retry);
                    if (lVar9 == 0) {
                      tVar11 = 0;
                    }
                    else {
                      tVar10 = time((time_t *)0x0);
                      tVar11 = lVar9 / 1000 + tVar10;
                      ppVar8 = (per_transfer *)CONCAT71(uStack_67,retry_2);
                    }
                    ppVar8->startat = tVar11;
                  }
                  else {
                    del_per_transfer(ppVar8);
                  }
                  bVar12 = true;
                }
                if ((!bVar12) &&
                   (tVar10 = time((time_t *)0x0), bVar13 = local_40 != tVar10, local_40 = tVar10,
                   bVar13)) {
                  bVar12 = true;
                }
                bVar3 = more_transfers;
                if ((bVar12) &&
                   (add_parallel_transfers(global,multi,share,&more_transfers,&added_transfers),
                   bVar3 = more_transfers, added_transfers == true)) {
                  still_running = 1;
                }
              }
            }
            progress_meter(global,&start,true);
            CVar6 = (uint)(iVar4 != 3) * 0x10 + CURLE_OUT_OF_MEMORY;
          }
LAB_00113b77:
          curl_multi_cleanup(multi);
        }
      }
      else {
        retry = false;
        CVar6 = create_transfer(global,share,&retry);
        if (CVar6 == CURLE_OK) {
          if (retry == true) {
            CVar7 = CURLE_OK;
            CVar6 = CURLE_OK;
            ppVar8 = transfers;
            do {
              while( true ) {
                if (((ppVar8 == (per_transfer *)0x0) ||
                    (CVar6 = pre_transfer(global,ppVar8), CVar6 != CURLE_OK)) ||
                   ((global->libcurl != (char *)0x0 &&
                    (CVar6 = easysrc_perform(), CVar6 != CURLE_OK)))) goto LAB_00113b86;
                CVar7 = curl_easy_perform(ppVar8->curl);
                CVar6 = post_per_transfer(global,ppVar8,CVar7,&retry_2,&start.tv_sec);
                if (retry_2 != true) break;
                tool_go_sleep(start.tv_sec);
              }
              bVar12 = true;
              if (CVar6 == CURLE_OK) {
                CVar6 = CURLE_OK;
                if (CVar7 < CURLE_TELNET_OPTION_SYNTAX) {
                  if ((0x10a0008000004U >> ((ulong)CVar7 & 0x3f) & 1) == 0) {
                    if ((ulong)CVar7 != 0) goto LAB_00113984;
                    goto LAB_0011398a;
                  }
                }
                else {
LAB_00113984:
                  if (global->fail_early == false) {
LAB_0011398a:
                    CVar6 = create_transfer(global,share,&retry);
                    bVar12 = CVar6 != CURLE_OK;
                  }
                }
              }
              ppVar8 = del_per_transfer(ppVar8);
            } while (!bVar12);
LAB_00113b86:
            if (CVar7 != CURLE_OK) {
              CVar6 = CVar7;
            }
            if (CVar6 != CURLE_OK) {
              single_transfer_cleanup(global->current);
              goto LAB_001137cf;
            }
          }
          CVar6 = CURLE_OK;
        }
      }
    }
LAB_001137cf:
    for (ppVar8 = transfers; ppVar8 != (per_transfer *)0x0; ppVar8 = del_per_transfer(ppVar8)) {
      CVar7 = post_per_transfer(global,ppVar8,CVar6,&retry,&start.tv_sec);
      if (CVar6 == CURLE_OK) {
        CVar6 = CVar7;
      }
      clean_getout(ppVar8->config);
    }
    global->noprogress = local_6a;
    global->isatty = local_6b;
    curl_share_cleanup(share);
    if (global->libcurl == (char *)0x0) {
      return CVar6;
    }
    easysrc_cleanup();
    dumpeasysrc(global);
    return CVar6;
  default:
    goto switchD_001136c4_caseD_1;
  case PARAM_HELP_REQUESTED:
    tool_help(global->help_category);
    break;
  case PARAM_MANUAL_REQUESTED:
    hugehelp();
    break;
  case PARAM_VERSION_INFO_REQUESTED:
    tool_version_info();
    break;
  case PARAM_ENGINES_REQUESTED:
    tool_list_engines();
    break;
  case PARAM_LIBCURL_UNSUPPORTED_PROTOCOL:
    CVar6 = CURLE_UNSUPPORTED_PROTOCOL;
    goto switchD_001136c4_caseD_1;
  }
  CVar6 = CURLE_OK;
switchD_001136c4_caseD_1:
  return CVar6;
}

Assistant:

CURLcode operate(struct GlobalConfig *global, int argc, argv_item_t argv[])
{
  CURLcode result = CURLE_OK;
  char *first_arg = curlx_convert_tchar_to_UTF8(argv[1]);

  /* Setup proper locale from environment */
#ifdef HAVE_SETLOCALE
  setlocale(LC_ALL, "");
#endif

  /* Parse .curlrc if necessary */
  if((argc == 1) ||
     (!curl_strequal(first_arg, "-q") &&
      !curl_strequal(first_arg, "--disable"))) {
    parseconfig(NULL, global); /* ignore possible failure */

    /* If we had no arguments then make sure a url was specified in .curlrc */
    if((argc < 2) && (!global->first->url_list)) {
      helpf(global->errors, NULL);
      result = CURLE_FAILED_INIT;
    }
  }

  curlx_unicodefree(first_arg);

  if(!result) {
    /* Parse the command line arguments */
    ParameterError res = parse_args(global, argc, argv);
    if(res) {
      result = CURLE_OK;

      /* Check if we were asked for the help */
      if(res == PARAM_HELP_REQUESTED)
        tool_help(global->help_category);
      /* Check if we were asked for the manual */
      else if(res == PARAM_MANUAL_REQUESTED)
        hugehelp();
      /* Check if we were asked for the version information */
      else if(res == PARAM_VERSION_INFO_REQUESTED)
        tool_version_info();
      /* Check if we were asked to list the SSL engines */
      else if(res == PARAM_ENGINES_REQUESTED)
        tool_list_engines();
      else if(res == PARAM_LIBCURL_UNSUPPORTED_PROTOCOL)
        result = CURLE_UNSUPPORTED_PROTOCOL;
      else
        result = CURLE_FAILED_INIT;
    }
    else {
#ifndef CURL_DISABLE_LIBCURL_OPTION
      if(global->libcurl) {
        /* Initialise the libcurl source output */
        result = easysrc_init();
      }
#endif

      /* Perform the main operations */
      if(!result) {
        size_t count = 0;
        struct OperationConfig *operation = global->first;
        CURLSH *share = curl_share_init();
        if(!share) {
#ifndef CURL_DISABLE_LIBCURL_OPTION
          if(global->libcurl) {
            /* Cleanup the libcurl source output */
            easysrc_cleanup();
          }
#endif
          return CURLE_OUT_OF_MEMORY;
        }

        curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
        curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_DNS);
        curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_SSL_SESSION);
        curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_CONNECT);
        curl_share_setopt(share, CURLSHOPT_SHARE, CURL_LOCK_DATA_PSL);

        /* Get the required arguments for each operation */
        do {
          result = get_args(operation, count++);

          operation = operation->next;
        } while(!result && operation);

        /* Set the current operation pointer */
        global->current = global->first;

        /* now run! */
        result = run_all_transfers(global, share, result);

        curl_share_cleanup(share);
#ifndef CURL_DISABLE_LIBCURL_OPTION
        if(global->libcurl) {
          /* Cleanup the libcurl source output */
          easysrc_cleanup();

          /* Dump the libcurl code if previously enabled */
          dumpeasysrc(global);
        }
#endif
      }
      else
        errorf(global, "out of memory\n");
    }
  }

  return result;
}